

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.h
# Opt level: O0

void __thiscall
spvtools::opt::TrimCapabilitiesPass::addSupportedExtensionsToSet<spv_operand_desc_t>
          (TrimCapabilitiesPass *this,spv_operand_desc_t *descriptor,ExtensionSet *output)

{
  uint uVar1;
  spv_target_env env;
  uint32_t uVar2;
  IRContext *this_00;
  ExtensionSet *output_local;
  spv_operand_desc_t *descriptor_local;
  TrimCapabilitiesPass *this_local;
  
  uVar1 = descriptor->minVersion;
  this_00 = Pass::context(&this->super_Pass);
  env = IRContext::GetTargetEnv(this_00);
  uVar2 = spvVersionForTargetEnv(env);
  if (uVar2 < uVar1) {
    EnumSet<spvtools::Extension>::insert<spvtools::Extension_const*>
              (output,descriptor->extensions,descriptor->extensions + descriptor->numExtensions);
  }
  return;
}

Assistant:

inline void addSupportedExtensionsToSet(const Descriptor* const descriptor,
                                          ExtensionSet* output) const {
    if (descriptor->minVersion <=
        spvVersionForTargetEnv(context()->GetTargetEnv())) {
      return;
    }
    output->insert(descriptor->extensions,
                   descriptor->extensions + descriptor->numExtensions);
  }